

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.y
# Opt level: O1

uint4 __thiscall CParse::convertFlag(CParse *this,string *str)

{
  _Rb_tree_color _Var1;
  iterator iVar2;
  string local_38;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ::find(&(this->keywords)._M_t,str);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->keywords)._M_t._M_impl.super__Rb_tree_header) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Unknown qualifier","");
    setError(this,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    _Var1 = _S_red;
  }
  else {
    _Var1 = iVar2._M_node[2]._M_color;
  }
  return _Var1;
}

Assistant:

uint4 CParse::convertFlag(string *str)

{
  map<string,uint4>::const_iterator iter;

  iter = keywords.find(*str);
  if (iter != keywords.end())
    return (*iter).second;
  setError("Unknown qualifier");
  return 0;
}